

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void gai_gatscat_new(int op,Integer g_a,void *v,void *subscript,Integer c_flag,Integer nv,
                    double *locbytes,double *totbytes,void *alpha)

{
  short sVar1;
  short sVar2;
  global_array_t *pgVar3;
  char *pcVar4;
  int iVar5;
  logical lVar6;
  void *__ptr;
  long lVar7;
  long lVar8;
  long in_RCX;
  long in_RDX;
  long lVar9;
  long in_RSI;
  int in_EDI;
  long in_R8;
  long in_R9;
  double *in_stack_00000008;
  int optype;
  char err_string [256];
  Integer _d_3;
  int _ndim_8;
  int _i_10;
  int _itmp_3;
  int _offset_1;
  int _ndim_7;
  int _i_9;
  int _index_3 [7];
  int _ndim_6;
  int _i_8;
  int _itmp_2;
  int _ndim_5;
  int _i_7;
  int _index_2 [7];
  int _ndim_4;
  int _i_6;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_2;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_1;
  Integer _nb;
  Integer _loc;
  Integer _iproc;
  Integer _p_handle;
  Integer _hi [7];
  Integer _lo [7];
  Integer _last;
  Integer _factor;
  Integer _w;
  Integer _d;
  Integer _offset;
  Integer _i_5;
  Integer _index2_1 [7];
  int _i_4;
  int _ndim_3;
  int _ndim_2;
  int _i_3;
  int _itmp_1;
  Integer _index2 [7];
  int _i_2;
  int _ndim_1;
  int _ndim;
  int _i_1;
  int _itmp;
  Integer _i;
  armci_giov_t desc;
  int *nblock;
  int maxlen;
  int rc;
  void **ptr_loc;
  void **ptr_rem;
  char *buf;
  Integer *nelems;
  Integer *list;
  Integer *header;
  Integer *subscript_ptr;
  Integer offset;
  Integer last;
  Integer jtot;
  Integer ld [6];
  Integer hi [7];
  Integer lo [7];
  Integer index [7];
  Integer tproc;
  Integer iproc;
  Integer me;
  Integer nprocs;
  Integer *proc;
  Integer num_rstrctd;
  Integer p_handle;
  Integer idx;
  int item_size;
  int type;
  int k;
  int j;
  int i;
  int ndim;
  Integer handle;
  int in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  int in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  undefined4 in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffabc;
  undefined4 in_stack_fffffffffffffac0;
  int in_stack_fffffffffffffac4;
  ulong local_448;
  int local_43c;
  int local_438;
  int local_434;
  int local_42c;
  int local_428 [7];
  int local_40c;
  int local_408;
  int local_404;
  int local_400;
  int local_3fc;
  int local_3f8 [10];
  int local_3d0;
  int local_3cc;
  long local_3c8;
  long local_3c0;
  long in_stack_fffffffffffffc48;
  char *in_stack_fffffffffffffc50;
  long local_3a8;
  long local_3a0;
  long local_388;
  char *local_378;
  long local_370;
  long local_368;
  char *local_358;
  C_Integer aCStack_348 [8];
  C_Integer aCStack_308 [8];
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long alStack_298 [2];
  Integer *in_stack_fffffffffffffd78;
  void *in_stack_fffffffffffffd80;
  Integer in_stack_fffffffffffffd88;
  Integer in_stack_fffffffffffffd90;
  int local_25c;
  int local_250;
  int local_24c;
  Integer *in_stack_fffffffffffffdb8;
  Integer *in_stack_fffffffffffffdc0;
  Integer in_stack_fffffffffffffdc8;
  Integer in_stack_fffffffffffffdd0;
  Integer *in_stack_fffffffffffffdd8;
  Integer *in_stack_fffffffffffffde0;
  Integer in_stack_fffffffffffffde8;
  int local_20c;
  int local_200;
  int local_1fc;
  long local_1f8;
  int local_1d0;
  int local_1cc;
  Integer *local_1b0;
  Integer *local_1a8;
  Integer *local_1a0;
  long *local_198;
  long local_190;
  long local_180;
  long local_178 [14];
  long local_108 [8];
  long local_c8 [7];
  char *local_90;
  char *local_88;
  Integer local_80;
  long local_78;
  long local_68;
  long local_60;
  long local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  int local_4;
  
  local_38 = in_RSI + 1000;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  local_80 = pnga_nodeid();
  lVar7 = local_38;
  pgVar3 = GA;
  local_68 = GA[local_38].num_rstrctd;
  local_60 = (long)GA[local_38].p_handle;
  if (local_60 < 0) {
    local_78 = GAnproc;
    if (0 < local_68) {
      local_78 = local_68;
    }
  }
  else {
    local_78 = (long)PGRP_LIST[local_60].map_nproc;
  }
  if (GA_prealloc_gatscat == 0) {
    local_1a0 = (Integer *)
                pnga_malloc(CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                            in_stack_fffffffffffffabc,
                            (char *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
    local_1a8 = (Integer *)
                pnga_malloc(CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                            in_stack_fffffffffffffabc,
                            (char *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
    local_1b0 = (Integer *)
                pnga_malloc(CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                            in_stack_fffffffffffffabc,
                            (char *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
  }
  else {
    if (GA_prealloc_gatscat < local_30) {
      pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    }
    local_1a0 = GA_header;
    local_1a8 = GA_list;
    local_1b0 = GA_elems;
  }
  local_3c = (int)GA[local_38].ndim;
  local_4c = GA[local_38].type;
  local_50 = GA[local_38].elemsize;
  *(double *)err_string._0_8_ = (double)(local_50 * local_30);
  for (local_40 = 0; local_40 < local_78; local_40 = local_40 + 1) {
    local_1b0[local_40] = 0;
    local_1a0[local_40] = -1;
  }
  for (local_40 = 0; local_40 < local_30; local_40 = local_40 + 1) {
    local_1a8[local_40] = 0;
  }
  local_1d0 = 1;
  for (local_40 = 0; local_40 < local_30; local_40 = local_40 + 1) {
    if (local_28 != 0) {
      for (local_1f8 = 0; local_1f8 < local_3c; local_1f8 = local_1f8 + 1) {
        local_c8[local_1f8] =
             (long)(*(int *)(*(long *)(local_20 + (long)local_40 * 8) +
                            ((local_3c + -1) - local_1f8) * 4) + 1);
      }
    }
    lVar6 = pnga_locate(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                        in_stack_fffffffffffffdd8);
    if (lVar6 == 0) {
      gai_print_subscript((char *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                          in_stack_fffffffffffffabc,
                          (Integer *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                          (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    }
    if (0 < local_68) {
      local_58 = GA[local_38].rank_rstrctd[local_58];
    }
    if (GA[local_38].distr_type == 1) {
      local_58 = local_58 % local_78;
    }
    else {
      local_24c = (int)local_58;
      if (GA[local_38].distr_type == 2) {
        sVar1 = GA[local_38].ndim;
        local_c8[0] = (long)local_24c % GA[local_38].num_blocks[0];
        local_1fc = local_24c;
        for (local_200 = 1; local_200 < sVar1; local_200 = local_200 + 1) {
          local_1fc = (int)(((long)local_1fc - local_c8[local_200 + -1]) /
                           GA[local_38].num_blocks[local_200 + -1]);
          local_c8[local_200] = (long)local_1fc % GA[local_38].num_blocks[local_200];
        }
        for (local_44 = 0; local_44 < local_3c; local_44 = local_44 + 1) {
          local_c8[local_44] = local_c8[local_44] % (long)pgVar3[lVar7].nblock[local_44];
        }
        iVar5 = (int)GA[local_38].ndim;
        for (local_20c = 0; local_20c < iVar5; local_20c = local_20c + 1) {
          *(long *)(&stack0xfffffffffffffdb8 + (long)local_20c * 8) =
               local_c8[local_20c] % (long)GA[local_38].nblock[local_20c];
        }
        local_58 = *(long *)(&stack0xfffffffffffffdb8 + (long)(iVar5 + -1) * 8);
        for (local_20c = iVar5 + -2; -1 < local_20c; local_20c = local_20c + -1) {
          local_58 = local_58 * GA[local_38].nblock[local_20c] +
                     *(long *)(&stack0xfffffffffffffdb8 + (long)local_20c * 8);
        }
      }
      else if ((GA[local_38].distr_type == 3) || (GA[local_38].distr_type == 4)) {
        sVar1 = GA[local_38].ndim;
        local_c8[0] = (long)local_24c % GA[local_38].num_blocks[0];
        for (local_250 = 1; local_250 < sVar1; local_250 = local_250 + 1) {
          local_24c = (int)(((long)local_24c - local_c8[local_250 + -1]) /
                           GA[local_38].num_blocks[local_250 + -1]);
          local_c8[local_250] = (long)local_24c % GA[local_38].num_blocks[local_250];
        }
        for (local_44 = 0; local_44 < local_3c; local_44 = local_44 + 1) {
          local_c8[local_44] = local_c8[local_44] % (long)pgVar3[lVar7].nblock[local_44];
        }
        iVar5 = (int)GA[local_38].ndim;
        for (local_25c = 0; local_25c < iVar5; local_25c = local_25c + 1) {
          alStack_298[local_25c] = local_c8[local_25c] % (long)GA[local_38].nblock[local_25c];
        }
        local_58 = alStack_298[iVar5 + -1];
        for (local_25c = iVar5 + -2; -1 < local_25c; local_25c = local_25c + -1) {
          local_58 = local_58 * GA[local_38].nblock[local_25c] + alStack_298[local_25c];
        }
      }
    }
    local_1b0[local_58] = local_1b0[local_58] + 1;
    if ((long)local_1d0 < local_1b0[local_58]) {
      local_1d0 = (int)local_1b0[local_58];
    }
    local_44 = (int)local_1a0[local_58];
    local_1a0[local_58] = (long)local_40;
    local_1a8[local_40] = (long)local_44;
  }
  *in_stack_00000008 = (double)((long)local_50 * local_1b0[local_80]);
  __ptr = malloc((long)(local_1d0 << 1) << 3);
  for (local_88 = (char *)0x0; (long)local_88 < local_78; local_88 = local_88 + 1) {
    if (0 < local_1b0[(long)local_88]) {
      local_44 = 0;
      for (local_58 = local_1a0[(long)local_88]; -1 < local_58; local_58 = local_1a8[local_58]) {
        if (local_28 == 0) {
          local_198 = (long *)(local_20 + local_58 * local_3c * 8);
        }
        else {
          for (local_2a0 = 0; local_2a0 < local_3c; local_2a0 = local_2a0 + 1) {
            local_c8[local_2a0] =
                 (long)(*(int *)(*(long *)(local_20 + local_58 * 8) +
                                ((local_3c + -1) - local_2a0) * 4) + 1);
          }
          local_198 = local_c8;
        }
        if (GA[local_38].distr_type == 0) {
          local_90 = local_88;
          local_2a8 = 0;
          local_2c0 = 1;
          local_2c8 = (long)(GA[local_38].ndim + -1);
          if (GA[local_38].distr_type == 0) {
            if (GA[local_38].num_rstrctd == 0) {
              lVar7 = (long)GA[local_38].ndim;
              local_388 = 0;
              local_368 = 1;
              for (local_370 = 0; local_370 < lVar7; local_370 = local_370 + 1) {
                local_368 = GA[local_38].nblock[local_370] * local_368;
              }
              if ((local_368 + -1 < (long)local_88) || ((long)local_88 < 0)) {
                for (local_370 = 0; local_370 < lVar7; local_370 = local_370 + 1) {
                  aCStack_308[local_370] = 0;
                  aCStack_348[local_370] = -1;
                }
              }
              else {
                local_378 = local_88;
                for (local_370 = 0; local_370 < lVar7; local_370 = local_370 + 1) {
                  lVar9 = (long)local_378 % (long)GA[local_38].nblock[local_370];
                  local_378 = (char *)((long)local_378 / (long)GA[local_38].nblock[local_370]);
                  lVar8 = lVar9 + local_388;
                  local_388 = GA[local_38].nblock[local_370] + local_388;
                  aCStack_308[local_370] = GA[local_38].mapc[lVar8];
                  if (lVar9 == GA[local_38].nblock[local_370] + -1) {
                    aCStack_348[local_370] = GA[local_38].dims[local_370];
                  }
                  else {
                    aCStack_348[local_370] = GA[local_38].mapc[lVar8 + 1] + -1;
                  }
                }
              }
            }
            else if ((long)local_88 < GA[local_38].num_rstrctd) {
              in_stack_fffffffffffffc48 = (long)GA[local_38].ndim;
              local_3c0 = 0;
              local_3a0 = 1;
              for (local_3a8 = 0; local_3a8 < in_stack_fffffffffffffc48; local_3a8 = local_3a8 + 1)
              {
                local_3a0 = GA[local_38].nblock[local_3a8] * local_3a0;
              }
              if ((local_3a0 + -1 < (long)local_88) || ((long)local_88 < 0)) {
                for (local_3a8 = 0; local_3a8 < in_stack_fffffffffffffc48; local_3a8 = local_3a8 + 1
                    ) {
                  aCStack_308[local_3a8] = 0;
                  aCStack_348[local_3a8] = -1;
                }
              }
              else {
                in_stack_fffffffffffffc50 = local_88;
                for (local_3a8 = 0; local_3a8 < in_stack_fffffffffffffc48; local_3a8 = local_3a8 + 1
                    ) {
                  lVar7 = (long)in_stack_fffffffffffffc50 % (long)GA[local_38].nblock[local_3a8];
                  in_stack_fffffffffffffc50 =
                       (char *)((long)in_stack_fffffffffffffc50 /
                               (long)GA[local_38].nblock[local_3a8]);
                  local_3c8 = lVar7 + local_3c0;
                  local_3c0 = GA[local_38].nblock[local_3a8] + local_3c0;
                  aCStack_308[local_3a8] = GA[local_38].mapc[local_3c8];
                  if (lVar7 == GA[local_38].nblock[local_3a8] + -1) {
                    aCStack_348[local_3a8] = GA[local_38].dims[local_3a8];
                  }
                  else {
                    aCStack_348[local_3a8] = GA[local_38].mapc[local_3c8 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[local_38].ndim;
              local_3d0 = (int)sVar1;
              for (local_3cc = 0; local_3cc < sVar1; local_3cc = local_3cc + 1) {
                aCStack_308[local_3cc] = 0;
                aCStack_348[local_3cc] = -1;
              }
            }
          }
          else {
            local_438 = (int)local_88;
            if (((GA[local_38].distr_type == 1) || (GA[local_38].distr_type == 2)) ||
               (GA[local_38].distr_type == 3)) {
              sVar1 = GA[local_38].ndim;
              local_400 = (int)sVar1;
              sVar2 = GA[local_38].ndim;
              local_40c = (int)sVar2;
              local_404 = local_438;
              local_3f8[0] = (int)((long)local_438 % GA[local_38].num_blocks[0]);
              for (local_408 = 1; local_408 < sVar2; local_408 = local_408 + 1) {
                local_404 = (int)((long)(local_404 - local_3f8[local_408 + -1]) /
                                 GA[local_38].num_blocks[local_408 + -1]);
                local_3f8[local_408] = (int)((long)local_404 % GA[local_38].num_blocks[local_408]);
              }
              for (local_3fc = 0; local_3fc < sVar1; local_3fc = local_3fc + 1) {
                aCStack_308[local_3fc] =
                     (long)local_3f8[local_3fc] * GA[local_38].block_dims[local_3fc] + 1;
                aCStack_348[local_3fc] =
                     (long)(local_3f8[local_3fc] + 1) * GA[local_38].block_dims[local_3fc];
                if (GA[local_38].dims[local_3fc] < aCStack_348[local_3fc]) {
                  aCStack_348[local_3fc] = GA[local_38].dims[local_3fc];
                }
              }
            }
            else if (GA[local_38].distr_type == 4) {
              sVar1 = GA[local_38].ndim;
              local_434 = 0;
              sVar2 = GA[local_38].ndim;
              local_428[0] = (int)((long)local_438 % GA[local_38].num_blocks[0]);
              for (local_43c = 1; local_43c < sVar2; local_43c = local_43c + 1) {
                local_438 = (int)((long)(local_438 - local_428[local_43c + -1]) /
                                 GA[local_38].num_blocks[local_43c + -1]);
                local_428[local_43c] = (int)((long)local_438 % GA[local_38].num_blocks[local_43c]);
              }
              for (local_42c = 0; local_42c < sVar1; local_42c = local_42c + 1) {
                aCStack_308[local_42c] = GA[local_38].mapc[local_434 + local_428[local_42c]];
                if ((long)local_428[local_42c] < GA[local_38].num_blocks[local_42c] + -1) {
                  aCStack_348[local_42c] =
                       GA[local_38].mapc[local_434 + local_428[local_42c] + 1] + -1;
                }
                else {
                  aCStack_348[local_42c] = GA[local_38].dims[local_42c];
                }
                local_434 = local_434 + (int)GA[local_38].num_blocks[local_42c];
              }
            }
          }
          pcVar4 = local_90;
          iVar5 = GA[local_38].p_handle;
          local_358 = local_90;
          for (local_448 = 0; (long)local_448 < (long)GA[local_38].ndim; local_448 = local_448 + 1)
          {
            if ((local_198[local_448] < aCStack_308[local_448]) ||
               (aCStack_348[local_448] < local_198[local_448])) {
              sprintf(&stack0xfffffffffffffab8,"check subscript failed:%ld not in (%ld:%ld) dim=%d",
                      local_198[local_448],aCStack_308[local_448],aCStack_348[local_448],
                      local_448 & 0xffffffff);
              pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
            }
          }
          for (local_2b0 = 0; local_2b0 < local_2c8; local_2b0 = local_2b0 + 1) {
            local_2b8 = GA[local_38].width[local_2b0];
            local_2a8 = ((local_198[local_2b0] - aCStack_308[local_2b0]) + local_2b8) * local_2c0 +
                        local_2a8;
            local_2c0 = ((aCStack_348[local_2b0] - aCStack_308[local_2b0]) + 1 + local_2b8 * 2) *
                        local_2c0;
          }
          local_2a8 = ((local_198[local_2c8] - aCStack_308[local_2c8]) +
                      GA[local_38].width[local_2c8]) * local_2c0 + local_2a8;
          if (iVar5 == 0) {
            local_358 = (char *)(long)PGRP_LIST->inv_map_proc_list[(long)pcVar4];
          }
          if (0 < GA[local_38].num_rstrctd) {
            local_358 = (char *)GA[local_38].rstrctd_list[(long)local_358];
          }
          *(char **)((long)__ptr + (long)local_44 * 8 + (long)local_1d0 * 8) =
               GA[local_38].ptr[(long)local_358] + local_2a8 * GA[local_38].elemsize;
        }
        else {
          lVar6 = pnga_locate(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                              in_stack_fffffffffffffdd8);
          if (lVar6 == 0) {
            gai_print_subscript((char *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0
                                                ),in_stack_fffffffffffffabc,
                                (Integer *)
                                CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                                (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8
                                                ));
            pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
          }
          pnga_distribution(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                            in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
          pnga_access_block_ptr
                    (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                     in_stack_fffffffffffffd78);
          pnga_release_block(local_10,(Integer)local_90);
          local_190 = 0;
          lVar7 = (long)(local_3c + -1);
          local_180 = 1;
          for (local_48 = 0; local_48 < lVar7; local_48 = local_48 + 1) {
            local_190 = (local_198[local_48] - local_108[local_48]) * local_180 + local_190;
            local_180 = local_178[local_48] * local_180;
          }
          *(long *)((long)__ptr + (long)local_44 * 8 + (long)local_1d0 * 8) =
               *(long *)((long)__ptr + (long)local_44 * 8 + (long)local_1d0 * 8) +
               ((local_198[lVar7] - local_108[lVar7]) * local_180 + local_190) * (long)local_50;
        }
        *(long *)((long)__ptr + (long)local_44 * 8) = local_18 + local_58 * local_50;
        local_44 = local_44 + 1;
      }
      if (local_68 < 1) {
        if (local_60 < 0) {
          local_90 = local_88;
        }
        else {
          local_90 = (char *)(long)PGRP_LIST[local_60].inv_map_proc_list[(long)local_88];
        }
      }
      else {
        local_90 = (char *)GA[local_38].rstrctd_list[(long)local_88];
      }
      in_stack_fffffffffffffab0 = local_4;
      if (local_4 == -99) {
        local_1cc = ARMCI_PutV((armci_giov_t *)CONCAT44(in_stack_fffffffffffffab4,0xffffff9d),
                               in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8);
        if (local_1cc != 0) {
          pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        }
      }
      else if (local_4 == -0x62) {
        local_1cc = ARMCI_GetV((armci_giov_t *)CONCAT44(in_stack_fffffffffffffab4,0xffffff9e),
                               in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8);
        if (local_1cc != 0) {
          pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        }
      }
      else if (local_4 == -0x61) {
        if (err_string._8_8_ != 0) {
          in_stack_fffffffffffffab4 = 0xffffffff;
          if (local_4c == 0x3ec) {
            in_stack_fffffffffffffab4 = 0x26;
          }
          else if (local_4c == 0x3ef) {
            in_stack_fffffffffffffab4 = 0x29;
          }
          else if (local_4c == 0x3ee) {
            in_stack_fffffffffffffab4 = 0x28;
          }
          else if (local_4c == 0x3e9) {
            in_stack_fffffffffffffab4 = 0x25;
          }
          else if (local_4c == 0x3ea) {
            in_stack_fffffffffffffab4 = 0x2a;
          }
          else if (local_4c == 0x3eb) {
            in_stack_fffffffffffffab4 = 0x27;
          }
          else {
            pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
          }
          local_1cc = ARMCI_AccV(in_stack_fffffffffffffac4,
                                 (void *)CONCAT44(in_stack_fffffffffffffabc,
                                                  in_stack_fffffffffffffab8),
                                 (armci_giov_t *)
                                 CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                                 in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8);
        }
        if (local_1cc != 0) {
          pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        }
      }
      else {
        pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      }
    }
  }
  free(__ptr);
  if (GA_prealloc_gatscat == 0) {
    pnga_free((void *)0x1fe5ae);
    pnga_free((void *)0x1fe5bb);
    pnga_free((void *)0x1fe5c8);
  }
  return;
}

Assistant:

void gai_gatscat_new(int op, Integer g_a, void* v, void *subscript,
                     Integer c_flag, Integer nv, double *locbytes,
                     double* totbytes, void *alpha)
{
    Integer handle=g_a+GA_OFFSET;
    int  ndim, i, j, k, type, item_size;
    Integer idx, p_handle, num_rstrctd;
    Integer *proc;
    Integer nprocs, me, iproc, tproc, index[MAXDIM];
    Integer lo[MAXDIM], hi[MAXDIM], ld[MAXDIM-1];
    Integer jtot, last, offset;
    Integer *subscript_ptr;

    Integer *header, *list, *nelems;
    char *buf;
    void **ptr_rem, **ptr_loc; 
    int rc, maxlen;
    int *nblock;
    armci_giov_t desc;

    

    me = pnga_nodeid();
    num_rstrctd = GA[handle].num_rstrctd;
    nblock = GA[handle].nblock;

    /* determine how many processors are associated with array */
    p_handle = GA[handle].p_handle;
    if (p_handle < 0) {
      nprocs = GAnproc;
      if (num_rstrctd > 0) nprocs = num_rstrctd;
    } else {
      nprocs = PGRP_LIST[p_handle].map_nproc;
    }

    if (!GA_prealloc_gatscat) {
      header =(Integer *)pnga_malloc(nprocs, MT_F_INT, "ga_gat_header");
      list =(Integer *)pnga_malloc(nv, MT_F_INT, "ga_gat_list");
      nelems =(Integer *)pnga_malloc(nprocs, MT_F_INT, "ga_gat_nelems");
    } else {
      if (GA_prealloc_gatscat < nv)
        pnga_error("Gather/scatter vector exceeds allocation length ",
                   GA_prealloc_gatscat);
      header = (Integer*)GA_header;
      list = (Integer*)GA_list;
      nelems = (Integer*)GA_elems;
    }

    ndim = GA[handle].ndim;
    type = GA[handle].type;
    item_size = GA[handle].elemsize;
    *totbytes = item_size * nv;

    /* Initialize linked list data structures */
    for (i=0; i<nprocs; i++) {
      nelems[i] = 0;
      header[i] = -1;
    }
    for (i=0; i<nv; i++) {
      list[i] = 0;
    }

    /* Set up linked list that partitions elements defined in subscripts array
     * into groups corresponding to the elements home processor
     */
    maxlen = 1;
    for (i=0; i<nv; i++) {
      if (c_flag) {
        gam_c2f_index(((int**)subscript)[i], index, ndim);
        subscript_ptr = index;
      } else {
        subscript_ptr = ((Integer*)subscript)+i*ndim;
      }
      if(!pnga_locate(g_a, subscript_ptr, &idx)) {
        gai_print_subscript("invalid subscript",ndim, subscript_ptr,"\n");
        pnga_error("failed -element:",i);
      }
      if (num_rstrctd > 0) idx = GA[handle].rank_rstrctd[idx];
      /* map from block to processor, if necessary */
      if (GA[handle].distr_type == BLOCK_CYCLIC) {
        idx = idx%nprocs;
      } else if (GA[handle].distr_type == SCALAPACK) {
        gam_find_block_indices(handle,idx,index);
        for (j=0; j<ndim; j++) {
          index[j] = index[j]%nblock[j];
        }
        gam_find_proc_from_sl_indices(handle,idx,index);
      } else if (GA[handle].distr_type == TILED ||
          GA[handle].distr_type == TILED_IRREG) {
        gam_find_block_indices(handle,idx,index);
        for (j=0; j<ndim; j++) {
          index[j] = index[j]%nblock[j];
        }
        gam_find_tile_proc_from_indices(handle,idx,index);
      }
      nelems[idx]++;
      if (maxlen<nelems[idx]) maxlen=nelems[idx];
      j = header[idx];
      header[idx] = i;
      list[i] = j;
    }
    *locbytes = item_size * nelems[me];

    /* allocate buffers for individual vector calls */
    buf = (char*)malloc(2*maxlen*sizeof(void*));
    ptr_loc = (void**)buf;
    ptr_rem = (void**)(buf+maxlen*sizeof(void*));

    for (iproc=0; iproc<nprocs; iproc++) {
      if (nelems[iproc] > 0) {
        /* loop through linked list to find all data elements associated with
         * the remote processor iproc
         */
        idx = header[iproc];
        j = 0;
        while (idx > -1) {
          if (c_flag) {
            gam_c2f_index(((int**)subscript)[idx], index, ndim);
            subscript_ptr = index;
          } else {
            subscript_ptr = ((Integer*)subscript)+idx*ndim;
          }
          if (GA[handle].distr_type == REGULAR) {
          /* gam_Loc_ptr modifies the value of the processor variable for
           * restricted arrays or processor groups, so make a temporary copy
           */
            tproc = iproc;
            gam_Loc_ptr(tproc, handle,  (subscript_ptr),
                ptr_rem+j);
          } else {
            /* TODO: Figure out how to get correct pointers for block cyclic
             * distributions */
            /* find block index from subscript */
            if(!pnga_locate(g_a, subscript_ptr, &tproc)) {
              gai_print_subscript("invalid subscript for block-cyclic array",
                                   ndim, subscript_ptr,"\n");
              pnga_error("failed -element:",idx);
            }
            pnga_distribution(g_a, tproc, lo, hi);
            pnga_access_block_ptr(g_a, tproc, ptr_rem+j, ld);
            pnga_release_block(g_a, tproc);
            offset = 0;
            last = ndim -1;
            jtot = 1;
            for (k=0; k<last; k++) {
              offset += ((subscript_ptr)[k]-lo[k])*jtot;
              jtot *= ld[k];
            }
            offset += ((subscript_ptr)[last]-lo[last])*jtot;
            ptr_rem[j] = (void*)(((char*)ptr_rem[j])+offset*item_size);
          }
          ptr_loc[j] = (void*)(((char*)v) + idx * item_size);
          idx = list[idx];
          j++;
        }
        /* correct remote proc if restricted arrays or processor groups are
         * being used
         */
        if (num_rstrctd > 0) {
          tproc = GA[handle].rstrctd_list[iproc];
        } else {
          if (p_handle < 0) {
            tproc = iproc;
          } else {
            tproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
          }
        }
        /* perform vector operation */
        switch(op) { 
          case GATHER:
            desc.bytes = (int)item_size;
            desc.src_ptr_array = ptr_rem;
            desc.dst_ptr_array = ptr_loc;
            desc.ptr_array_len = (int)nelems[iproc];
            rc=ARMCI_GetV(&desc, 1, (int)tproc);
            if(rc) pnga_error("gather failed in armci",rc);
            break;
          case SCATTER:
            desc.bytes = (int)item_size;
            desc.src_ptr_array = ptr_loc;
            desc.dst_ptr_array = ptr_rem;
            desc.ptr_array_len = (int)nelems[iproc];
            rc=ARMCI_PutV(&desc, 1, (int)tproc);
            if(rc) pnga_error("scatter failed in armci",rc);
            break;
          case SCATTER_ACC:
            desc.bytes = (int)item_size;
            desc.src_ptr_array = ptr_loc;
            desc.dst_ptr_array = ptr_rem;
            desc.ptr_array_len = (int)nelems[iproc];
            if(alpha != NULL) {
              int optype=-1;
              if(type==C_DBL) optype= ARMCI_ACC_DBL;
              else if(type==C_DCPL)optype= ARMCI_ACC_DCP;
              else if(type==C_SCPL)optype= ARMCI_ACC_CPL;
              else if(type==C_INT)optype= ARMCI_ACC_INT;
              else if(type==C_LONG)optype= ARMCI_ACC_LNG;
              else if(type==C_FLOAT)optype= ARMCI_ACC_FLT; 
              else pnga_error("type not supported",type);
              rc= ARMCI_AccV(optype, alpha, &desc, 1, (int)tproc);
            }
            if(rc) pnga_error("scatter_acc failed in armci",rc);
            break;
          default: pnga_error("operation not supported",op);
        }
      }
    }
    free(buf);
    if (!GA_prealloc_gatscat) {
      pnga_free(nelems);
      pnga_free(list);
      pnga_free(header);
    }

}